

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlDocPtr xmlNewDoc(xmlChar *version)

{
  _xmlDoc *__s;
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  
  __s = (_xmlDoc *)(*xmlMalloc)(0xb0);
  if (__s == (_xmlDoc *)0x0) {
    xmlTreeErrMemory("building doc");
  }
  else {
    pxVar1 = "1.0";
    if (version != (xmlChar *)0x0) {
      pxVar1 = version;
    }
    memset(__s,0,0xb0);
    __s->type = XML_DOCUMENT_NODE;
    pxVar1 = xmlStrdup(pxVar1);
    __s->version = pxVar1;
    if (pxVar1 != (xmlChar *)0x0) {
      *(xmlNs **)&__s->compression = (xmlNs *)0xffffffffffffffff;
      __s->doc = __s;
      __s->parseFlags = 0;
      __s->properties = 0x20;
      __s->charset = 1;
      if (__xmlRegisterCallbacks == 0) {
        return __s;
      }
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var2 == (xmlRegisterNodeFunc)0x0) {
        return __s;
      }
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)__s);
      return __s;
    }
    xmlTreeErrMemory("building doc");
    (*xmlFree)(__s);
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlNewDoc(const xmlChar *version) {
    xmlDocPtr cur;

    if (version == NULL)
	version = (const xmlChar *) "1.0";

    /*
     * Allocate a new document and fill the fields.
     */
    cur = (xmlDocPtr) xmlMalloc(sizeof(xmlDoc));
    if (cur == NULL) {
	xmlTreeErrMemory("building doc");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlDoc));
    cur->type = XML_DOCUMENT_NODE;

    cur->version = xmlStrdup(version);
    if (cur->version == NULL) {
	xmlTreeErrMemory("building doc");
	xmlFree(cur);
	return(NULL);
    }
    cur->standalone = -1;
    cur->compression = -1; /* not initialized */
    cur->doc = cur;
    cur->parseFlags = 0;
    cur->properties = XML_DOC_USERBUILT;
    /*
     * The in memory encoding is always UTF8
     * This field will never change and would
     * be obsolete if not for binary compatibility.
     */
    cur->charset = XML_CHAR_ENCODING_UTF8;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}